

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O3

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
VerifyQueueSlots(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
                 *this)

{
  pointer pvVar1;
  pointer pvVar2;
  ostream *poVar3;
  CritScope cs;
  CritScope CStack_188;
  FatalMessage local_180;
  
  rtc::CritScope::CritScope(&CStack_188,&this->crit_queue_);
  pvVar2 = (this->queue_).
           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->queue_).
           super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != pvVar1) {
    do {
      if ((ulong)((long)(pvVar2->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)(pvVar2->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 1) <
          (this->queue_item_verifier_).minimum_capacity_) {
        rtc::FatalMessage::FatalMessage
                  (&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0xb9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_180,"Check failed: queue_item_verifier_(v)",0x25);
        std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18)
                       );
        std::ostream::put((char)&local_180);
        poVar3 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
        rtc::FatalMessage::~FatalMessage(&local_180);
      }
      pvVar2 = pvVar2 + 1;
    } while (pvVar2 != pvVar1);
  }
  rtc::CritScope::~CritScope(&CStack_188);
  return true;
}

Assistant:

bool VerifyQueueSlots() {
    rtc::CritScope cs(&crit_queue_);
    for (const auto& v : queue_) {
      RTC_DCHECK(queue_item_verifier_(v));
    }
    return true;
  }